

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqliteVmLoadCollection(unqlite_vm *pVm,char *zName,sxu32 nByte,int iFlag,unqlite_col **ppOut)

{
  SyMemBackend *pBackend;
  byte bVar1;
  byte bVar2;
  uint uVar3;
  unqlite_kv_engine *puVar4;
  unqlite_kv_methods *puVar5;
  jx9_vm *pjVar6;
  ushort *puVar7;
  _func_void_unqlite_kv_cursor_ptr *p_Var8;
  ushort uVar9;
  ushort uVar10;
  int iVar11;
  int iVar12;
  unqlite_col *pCol;
  ulong uVar13;
  char *pChunk;
  unqlite_col_record **ppuVar14;
  uint uVar15;
  unqlite_col_record **ppuVar16;
  unqlite *pDb;
  unqlite_kv_cursor *pCursor;
  unqlite_col *local_58;
  uint local_4c;
  unqlite_kv_methods *local_48;
  unqlite_col **local_40;
  unqlite_kv_engine *local_38;
  
  pDb = pVm->pDb;
  puVar4 = ((pDb->sDB).pPager)->pEngine;
  puVar5 = puVar4->pIo->pMethods;
  local_4c = nByte;
  iVar11 = unqliteInitCursor(pDb,(unqlite_kv_cursor **)&local_58);
  uVar3 = local_4c;
  pCol = local_58;
  if (iVar11 != 0) {
    return iVar11;
  }
  local_48 = puVar5;
  local_40 = ppOut;
  local_38 = puVar4;
  if ((iFlag & 1U) == 0) {
    iVar11 = (*puVar5->xSeek)((unqlite_kv_cursor *)local_58,zName,local_4c,1);
    if (((iFlag & 2U) == 0) && (iVar11 != 0)) {
      unqliteGenErrorFormat
                (pDb,"Collection \'%.*s\' not defined in the underlying database",(ulong)uVar3,zName
                );
    }
    else if ((iFlag & 2U) == 0) goto LAB_001190a4;
    p_Var8 = ((pDb->sDB).pPager)->pEngine->pIo->pMethods->xCursorRelease;
    if (p_Var8 != (_func_void_unqlite_kv_cursor_ptr *)0x0) {
      (*p_Var8)((unqlite_kv_cursor *)pCol);
    }
  }
  else {
LAB_001190a4:
    pBackend = &pVm->sAlloc;
    pCol = (unqlite_col *)SyMemBackendPoolAlloc(pBackend,0x140);
    if (pCol == (unqlite_col *)0x0) {
      unqliteGenError(pDb,"unQLite is running out of memory");
      iVar11 = -1;
      pChunk = (char *)0x0;
    }
    else {
      uVar13 = 0xfffffffffffffffc;
      do {
        *(undefined4 *)((long)&pCol->pVm + uVar13 + 4) = 0;
        uVar13 = uVar13 + 4;
      } while (uVar13 < 0x13c);
      (pCol->sWorker).pBlob = (void *)0x0;
      (pCol->sWorker).nByte = 0;
      (pCol->sWorker).mByte = 0;
      (pCol->sWorker).pAllocator = pBackend;
      (pCol->sWorker).nFlags = 0;
      (pCol->sHeader).pBlob = (void *)0x0;
      (pCol->sHeader).nByte = 0;
      (pCol->sHeader).mByte = 0;
      (pCol->sHeader).pAllocator = pBackend;
      (pCol->sHeader).nFlags = 0;
      pCol->pVm = pVm;
      pCol->pCursor = (unqlite_kv_cursor *)local_58;
      pChunk = SyMemBackendStrDup(pBackend,zName,uVar3);
      if (pChunk == (char *)0x0) {
        unqliteGenError(pDb,"unQLite is running out of memory");
        iVar11 = -1;
        pChunk = (char *)0x0;
      }
      else {
        pCol->nRecSize = 0x40;
        ppuVar14 = (unqlite_col_record **)SyMemBackendAlloc(pBackend,0x200);
        pCol->apRecord = ppuVar14;
        if (ppuVar14 == (unqlite_col_record **)0x0) {
          unqliteGenError(pDb,"unQLite is running out of memory");
          iVar11 = -1;
        }
        else {
          uVar15 = pCol->nRecSize << 3;
          if (uVar15 != 0) {
            ppuVar16 = (unqlite_col_record **)((ulong)uVar15 + (long)ppuVar14);
            do {
              *(undefined1 *)ppuVar14 = 0;
              if (ppuVar16 <= (unqlite_col_record **)((long)ppuVar14 + 1)) break;
              *(undefined1 *)((long)ppuVar14 + 1) = 0;
              if (ppuVar16 <= (unqlite_col_record **)((long)ppuVar14 + 2)) break;
              *(undefined1 *)((long)ppuVar14 + 2) = 0;
              if (ppuVar16 <= (unqlite_col_record **)((long)ppuVar14 + 3)) break;
              *(undefined1 *)((long)ppuVar14 + 3) = 0;
              ppuVar14 = (unqlite_col_record **)((long)ppuVar14 + 4);
            } while (ppuVar14 < ppuVar16);
          }
          (pCol->sName).zString = pChunk;
          (pCol->sName).nByte = uVar3;
          pjVar6 = pVm->pJx9Vm;
          (pCol->sSchema).pVm = (jx9_vm *)0x0;
          (pCol->sSchema).sBlob.pAllocator = (SyMemBackend *)0x0;
          (pCol->sSchema).x.rVal = 0.0;
          *(undefined8 *)&(pCol->sSchema).iFlags = 0;
          *(undefined8 *)&(pCol->sSchema).sBlob.nFlags = 0;
          *(undefined8 *)&(pCol->sSchema).nIdx = 0;
          (pCol->sSchema).pVm = pjVar6;
          (pCol->sSchema).sBlob.pBlob = (void *)0x0;
          (pCol->sSchema).sBlob.nByte = 0;
          (pCol->sSchema).sBlob.mByte = 0;
          (pCol->sSchema).sBlob.pAllocator = &pjVar6->sAllocator;
          (pCol->sSchema).iFlags = 0x20;
          if ((iFlag & 1U) == 0) {
            (pCol->sHeader).nByte = 0;
            uVar3 = (pCol->sHeader).nFlags;
            if ((uVar3 & 4) != 0) {
              (pCol->sHeader).pBlob = (void *)0x0;
              (pCol->sHeader).mByte = 0;
              (pCol->sHeader).nFlags = uVar3 & 0xfffffffb;
            }
            iVar11 = (*pCol->pCursor->pStore->pIo->pMethods->xData)
                               (pCol->pCursor,unqliteDataConsumer,&pCol->sHeader);
            if (iVar11 == 0) {
              uVar3 = (pCol->sHeader).nByte;
              iVar11 = -0x18;
              if ((0x15 < uVar3) &&
                 (puVar7 = (ushort *)(pCol->sHeader).pBlob,
                 (ushort)(*puVar7 << 8 | *puVar7 >> 8) == 0x611e)) {
                SyBigEndianUnpack64((uchar *)(puVar7 + 1),(sxu64 *)&pCol->nLastid);
                SyBigEndianUnpack64((uchar *)(puVar7 + 5),(sxu64 *)&pCol->nTotRec);
                bVar1 = *(byte *)((long)puVar7 + 0x15);
                uVar9 = puVar7[10];
                bVar2 = *(byte *)((long)puVar7 + 0x13);
                uVar10 = puVar7[9];
                (pCol->sCreation).tm_isdst = 0;
                (pCol->sCreation).tm_year = (byte)((byte)uVar10 >> 1) + 0x7bc;
                (pCol->sCreation).tm_mon =
                     ((uint)(byte)uVar10 << 0x18 | (uint)bVar2 << 0x10) >> 0x15 & 0xf;
                (pCol->sCreation).tm_mday = bVar2 & 0x1f;
                (pCol->sCreation).tm_hour = (uint)(byte)((byte)uVar9 >> 3);
                (pCol->sCreation).tm_min = (ushort)(CONCAT11((byte)uVar9,bVar1) >> 5) & 0x3f;
                (pCol->sCreation).tm_sec = (uint)bVar1 + (uint)bVar1 & 0x3e;
                pCol->nSchemaOfft = (int)(puVar7 + 0xb) - *(int *)&(pCol->sHeader).pBlob;
                if (uVar3 != 0x16) {
                  FastJsonDecode(puVar7 + 0xb,uVar3 - 0x16,&pCol->sSchema,(uchar **)0x0,0);
                }
LAB_0011942d:
                unqliteVmInstallCollection(pVm,pCol);
                if (local_40 == (unqlite_col **)0x0) {
                  return 0;
                }
                *local_40 = pCol;
                return 0;
              }
            }
            unqliteGenErrorFormat(pDb,"Corrupt collection \'%z\' header",&pCol->sName);
          }
          else if (local_48->xReplace ==
                   (_func_int_unqlite_kv_engine_ptr_void_ptr_int_void_ptr_unqlite_int64 *)0x0) {
            unqliteGenErrorFormat
                      (pDb,
                       "Cannot create new collection \'%z\' due to a read-only Key/Value storage engine"
                       ,&pCol->sName);
            iVar11 = -10;
          }
          else {
            iVar12 = CollectionSetHeader(local_38,pCol,0,0,(jx9_value *)0x0);
            iVar11 = -10;
            if (iVar12 == 0) goto LAB_0011942d;
          }
        }
      }
    }
    p_Var8 = ((pDb->sDB).pPager)->pEngine->pIo->pMethods->xCursorRelease;
    if (p_Var8 != (_func_void_unqlite_kv_cursor_ptr *)0x0) {
      (*p_Var8)((unqlite_kv_cursor *)local_58);
    }
    SyMemBackendPoolFree(&pDb->sMem,local_58);
    if (pChunk != (char *)0x0) {
      SyMemBackendFree(pBackend,pChunk);
    }
    if (pCol == (unqlite_col *)0x0) {
      return iVar11;
    }
    if (pCol->apRecord != (unqlite_col_record **)0x0) {
      SyMemBackendFree(pBackend,pCol->apRecord);
    }
    SyBlobRelease(&pCol->sHeader);
    SyBlobRelease(&pCol->sWorker);
    jx9MemObjRelease(&pCol->sSchema);
    pDb = (unqlite *)pBackend;
  }
  SyMemBackendPoolFree(&pDb->sMem,pCol);
  return iVar11;
}

Assistant:

static int unqliteVmLoadCollection(
	unqlite_vm *pVm,    /* Target VM */
	const char *zName,  /* Collection name */
	sxu32 nByte,        /* zName length */
	int iFlag,          /* Control flag */
	unqlite_col **ppOut /* OUT: in-memory collection */
	)
{
	unqlite_kv_methods *pMethods;
	unqlite_kv_engine *pEngine;
	unqlite_kv_cursor *pCursor;
	unqlite *pDb = pVm->pDb;
	unqlite_col *pCol = 0; /* cc warning */
	int rc = SXERR_MEM;
	char *zDup = 0;
	/* Point to the underlying KV store */
	pEngine = unqlitePagerGetKvEngine(pVm->pDb);
	pMethods = pEngine->pIo->pMethods;
	/* Allocate a new cursor */
	rc = unqliteInitCursor(pDb,&pCursor);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	if( (iFlag & UNQLITE_VM_COLLECTION_CREATE) == 0 ){
		/* Seek to the desired location */
		rc = pMethods->xSeek(pCursor,(const void *)zName,(int)nByte,UNQLITE_CURSOR_MATCH_EXACT);
		if( rc != UNQLITE_OK && (iFlag & UNQLITE_VM_COLLECTION_EXISTS) == 0){
			unqliteGenErrorFormat(pDb,"Collection '%.*s' not defined in the underlying database",nByte,zName);

			unqliteReleaseCursor(pDb,pCursor);
			return rc;
		}
		else if((iFlag & UNQLITE_VM_COLLECTION_EXISTS)){
			unqliteReleaseCursor(pDb,pCursor);
			return rc;
		}
	}
	/* Allocate a new instance */
	pCol = (unqlite_col *)SyMemBackendPoolAlloc(&pVm->sAlloc,sizeof(unqlite_col));
	if( pCol == 0 ){
		unqliteGenOutofMem(pDb);
		rc = UNQLITE_NOMEM;
		goto fail;
	}
	SyZero(pCol,sizeof(unqlite_col));
	/* Fill in the structure */
	SyBlobInit(&pCol->sWorker,&pVm->sAlloc);
	SyBlobInit(&pCol->sHeader,&pVm->sAlloc);
	pCol->pVm = pVm;
	pCol->pCursor = pCursor;
	/* Duplicate collection name */
	zDup = SyMemBackendStrDup(&pVm->sAlloc,zName,nByte);
	if( zDup == 0 ){
		unqliteGenOutofMem(pDb);
		rc = UNQLITE_NOMEM;
		goto fail;
	}
	pCol->nRecSize = 64; /* Must be a power of two */
	pCol->apRecord = (unqlite_col_record **)SyMemBackendAlloc(&pVm->sAlloc,pCol->nRecSize * sizeof(unqlite_col_record *));
	if( pCol->apRecord == 0 ){
		unqliteGenOutofMem(pDb);
		rc = UNQLITE_NOMEM;
		goto fail;
	}
	/* Zero the table */
	SyZero((void *)pCol->apRecord,pCol->nRecSize * sizeof(unqlite_col_record *));
	SyStringInitFromBuf(&pCol->sName,zDup,nByte);
	jx9MemObjInit(pVm->pJx9Vm,&pCol->sSchema);
	if( iFlag & UNQLITE_VM_COLLECTION_CREATE ){
		/* Create a new collection */
		if( pMethods->xReplace == 0 ){
			/* Read-only KV engine: Generate an error message and return */
			unqliteGenErrorFormat(pDb,
				"Cannot create new collection '%z' due to a read-only Key/Value storage engine",
				&pCol->sName
			);
			rc = UNQLITE_ABORT; /* Abort VM execution */
			goto fail;
		}
		/* Write the collection header */
		rc = CollectionSetHeader(pEngine,pCol,0,0,0);
		if( rc != UNQLITE_OK ){
			rc = UNQLITE_ABORT; /* Abort VM execution */
			goto fail;
		}
	}else{
		/* Read the collection header */
		rc = CollectionLoadHeader(pCol);
		if( rc != UNQLITE_OK ){
			unqliteGenErrorFormat(pDb,"Corrupt collection '%z' header",&pCol->sName);
			goto fail;
		}
	}
	/* Finally install the collection */
	unqliteVmInstallCollection(pVm,pCol);
	/* All done */
	if( ppOut ){
		*ppOut = pCol;
	}
	return UNQLITE_OK;
fail:
	unqliteReleaseCursor(pDb,pCursor);
	if( zDup ){
		SyMemBackendFree(&pVm->sAlloc,zDup);
	}
	if( pCol ){
		if( pCol->apRecord ){
			SyMemBackendFree(&pVm->sAlloc,(void *)pCol->apRecord);
		}
		SyBlobRelease(&pCol->sHeader);
		SyBlobRelease(&pCol->sWorker);
		jx9MemObjRelease(&pCol->sSchema);
		SyMemBackendPoolFree(&pVm->sAlloc,pCol);
	}
	return rc;
}